

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapper.cpp
# Opt level: O0

ostream * pstore::operator<<(ostream *os,memory_mapper_base *mm)

{
  ostream *poVar1;
  uint64_t uVar2;
  memory_mapper_base *mm_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"{ offset: ");
  uVar2 = memory_mapper_base::offset(mm);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  poVar1 = std::operator<<(poVar1,", size: ");
  uVar2 = memory_mapper_base::size(mm);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  poVar1 = std::operator<<(poVar1," }");
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & os, memory_mapper_base const & mm) {
        return os << "{ offset: " << mm.offset () << ", size: " << mm.size () << " }";
    }